

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d.c
# Opt level: O3

void av1_gen_fwd_stage_range
               (int8_t *stage_range_col,int8_t *stage_range_row,TXFM_2D_FLIP_CFG *cfg,int bd)

{
  char *pcVar1;
  ulong uVar2;
  
  pcVar1 = cfg->shift;
  if (0 < cfg->stage_num_col) {
    uVar2 = 0;
    do {
      stage_range_col[uVar2] = cfg->stage_range_col[uVar2] + (char)bd + *pcVar1 + '\x01';
      if (10 < uVar2) break;
      uVar2 = uVar2 + 1;
    } while ((long)uVar2 < (long)cfg->stage_num_col);
  }
  if (0 < cfg->stage_num_row) {
    uVar2 = 0;
    do {
      stage_range_row[uVar2] = cfg->stage_range_row[uVar2] + (char)bd + *pcVar1 + pcVar1[1] + '\x01'
      ;
      if (10 < uVar2) {
        return;
      }
      uVar2 = uVar2 + 1;
    } while ((long)uVar2 < (long)cfg->stage_num_row);
  }
  return;
}

Assistant:

void av1_gen_fwd_stage_range(int8_t *stage_range_col, int8_t *stage_range_row,
                             const TXFM_2D_FLIP_CFG *cfg, int bd) {
  // Take the shift from the larger dimension in the rectangular case.
  const int8_t *shift = cfg->shift;
  // i < MAX_TXFM_STAGE_NUM will mute above array bounds warning
  for (int i = 0; i < cfg->stage_num_col && i < MAX_TXFM_STAGE_NUM; ++i) {
    stage_range_col[i] = cfg->stage_range_col[i] + shift[0] + bd + 1;
  }

  // i < MAX_TXFM_STAGE_NUM will mute above array bounds warning
  for (int i = 0; i < cfg->stage_num_row && i < MAX_TXFM_STAGE_NUM; ++i) {
    stage_range_row[i] = cfg->stage_range_row[i] + shift[0] + shift[1] + bd + 1;
  }
}